

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

int get_font_list(char *base_font_name_list,char ***flist)

{
  char **ppcVar1;
  ushort **ppuVar2;
  char *pcVar3;
  bool bVar4;
  int local_38;
  int local_34;
  int i;
  int l;
  int nb_name;
  int nb;
  char *p;
  char *ptr;
  char ***flist_local;
  char *base_font_name_list_local;
  
  l = 0;
  i = 1;
  for (p = base_font_name_list; *p != '\0'; p = p + 1) {
    if (*p == ',') {
      i = i + 1;
    }
  }
  ppcVar1 = (char **)malloc((long)i << 3);
  *flist = ppcVar1;
  p = base_font_name_list;
  while (*p != '\0') {
    local_34 = 0;
    local_38 = 0;
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)*p] & 0x2000) != 0) {
      p = p + 1;
    }
    _nb_name = p;
    while( true ) {
      bVar4 = false;
      if (*p != '\0') {
        bVar4 = *p != ',';
      }
      if (!bVar4) break;
      p = p + 1;
      local_34 = local_34 + 1;
    }
    if (2 < local_34) {
      pcVar3 = (char *)malloc((ulong)(local_34 + 2));
      (*flist)[l] = pcVar3;
      for (; _nb_name != p; _nb_name = _nb_name + 1) {
        (*flist)[l][local_38] = *_nb_name;
        local_38 = local_38 + 1;
      }
      (*flist)[l][local_38] = '\0';
      l = l + 1;
    }
    if (*p != '\0') {
      p = p + 1;
    }
  }
  if (l < 1) {
    free(*flist);
    *flist = (char **)0x0;
  }
  return l;
}

Assistant:

static int
get_font_list(
	const char	*base_font_name_list,
	char 		***flist) {
  const char *ptr;
  const char *p;
  int nb;
  int nb_name;

  ptr = base_font_name_list;
  p = NULL;
  nb = 0;
  nb_name = 1;

  while (*ptr) {
    if (*ptr == ',') nb_name++;
    ptr++;
  }

  *flist = (char **) malloc(sizeof(char*) * nb_name);
  ptr = base_font_name_list;

  while (*ptr) {
    int l = 0, i = 0;

    while(isspace((int)(unsigned char)*ptr)) ptr++;
    p = ptr;
    while (*ptr && *ptr != ',') { ptr++; l++; }
    if (l > 2) {
      (*flist)[nb] = (char*) malloc((unsigned)l + 2);
      while (p != ptr) { ((*flist)[nb])[i] = *p; i++; p++; }
      (*flist)[nb][i] = '\0';
      nb++;
    }
    if (*ptr) ptr++;
  }
  if (nb < 1) {
    free(*flist);
    *flist = (char**)NULL;
  }
  return nb;
}